

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vsx-impl.inc.c
# Opt level: O2

void gen_mtvsrdd(DisasContext_conflict10 *ctx)

{
  ushort uVar1;
  TCGContext_conflict10 *tcg_ctx;
  TCGv_i64 ret;
  uintptr_t o;
  uint32_t uStack_20;
  
  tcg_ctx = ctx->uc->tcg_ctx;
  if ((ctx->opcode & 1) == 0) {
    if (ctx->vsx_enabled != false) {
LAB_00a1452a:
      ret = tcg_temp_new_i64(tcg_ctx);
      uVar1 = *(ushort *)((long)&ctx->opcode + 2);
      if ((uVar1 & 0x1f) == 0) {
        tcg_gen_movi_i64_ppc64(tcg_ctx,ret,0);
      }
      else {
        tcg_gen_mov_i64_ppc64(tcg_ctx,ret,cpu_gpr[(ulong)uVar1 & 0x1f]);
      }
      set_cpu_vsrh(tcg_ctx,ctx->opcode >> 0x15 & 0x1f | (ctx->opcode & 1) << 5,ret);
      tcg_gen_mov_i64_ppc64
                (tcg_ctx,ret,*(TCGv_i64 *)((long)cpu_gpr + (ulong)(ctx->opcode >> 8 & 0xf8)));
      set_cpu_vsrl(tcg_ctx,ctx->opcode >> 0x15 & 0x1f | (ctx->opcode & 1) << 5,ret);
      tcg_temp_free_internal_ppc64(tcg_ctx,(TCGTemp *)(ret + (long)tcg_ctx));
      return;
    }
    uStack_20 = 0x5e;
  }
  else {
    if (ctx->altivec_enabled != false) goto LAB_00a1452a;
    uStack_20 = 0x49;
  }
  gen_exception(ctx,uStack_20);
  return;
}

Assistant:

static void gen_mtvsrdd(DisasContext *ctx)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    TCGv_i64 t0;
    if (xT(ctx->opcode) < 32) {
        if (unlikely(!ctx->vsx_enabled)) {
            gen_exception(ctx, POWERPC_EXCP_VSXU);
            return;
        }
    } else {
        if (unlikely(!ctx->altivec_enabled)) {
            gen_exception(ctx, POWERPC_EXCP_VPU);
            return;
        }
    }

    t0 = tcg_temp_new_i64(tcg_ctx);
    if (!rA(ctx->opcode)) {
        tcg_gen_movi_i64(tcg_ctx, t0, 0);
    } else {
        tcg_gen_mov_i64(tcg_ctx, t0, cpu_gpr[rA(ctx->opcode)]);
    }
    set_cpu_vsrh(tcg_ctx, xT(ctx->opcode), t0);

    tcg_gen_mov_i64(tcg_ctx, t0, cpu_gpr[rB(ctx->opcode)]);
    set_cpu_vsrl(tcg_ctx, xT(ctx->opcode), t0);
    tcg_temp_free_i64(tcg_ctx, t0);
}